

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxout.cpp
# Opt level: O3

SPxOut * __thiscall soplex::SPxOut::operator=(SPxOut *this,SPxOut *base)

{
  long lVar1;
  
  if (this != base) {
    this->m_verbosity = base->m_verbosity;
  }
  lVar1 = 0;
  do {
    this->m_streams[lVar1 + 2] = base->m_streams[lVar1 + 2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return this;
}

Assistant:

SPxOut& SPxOut::operator=(const SPxOut& base)
{
   if(this != &base)
      m_verbosity = base.m_verbosity;

   for(int i = DEBUG; i <= INFO3; ++i)
      m_streams[ i ] = base.m_streams[ i ];

   return *this;
}